

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall
BuildWithDepsLogTestDepsIgnoredInDryRun::Run(BuildWithDepsLogTestDepsIgnoredInDryRun *this)

{
  VirtualFileSystem *this_00;
  int *piVar1;
  pointer pcVar2;
  pointer pcVar3;
  int iVar4;
  long lVar5;
  Test *pTVar6;
  _Head_base<0UL,_CommandRunner_*,_false> _Var7;
  bool bVar8;
  int iVar9;
  Node *pNVar10;
  string err;
  Builder builder;
  State state;
  string local_250;
  string local_230;
  undefined1 local_210 [128];
  _Head_base<0UL,_CommandRunner_*,_false> local_190;
  undefined1 local_138 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  local_100;
  pointer local_d0;
  pointer local_c0;
  undefined **local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  local_80;
  pointer local_48;
  pointer local_38;
  
  pcVar3 = local_138 + 0x10;
  local_138._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"out","");
  pcVar2 = local_210 + 0x10;
  local_210._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"");
  this_00 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_;
  VirtualFileSystem::Create(this_00,(string *)local_138,(string *)local_210);
  if ((pointer)local_210._0_8_ != pcVar2) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if ((pointer)local_138._0_8_ != pcVar3) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  piVar1 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.now_;
  *piVar1 = *piVar1 + 1;
  local_138._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"in1","");
  local_210._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"");
  VirtualFileSystem::Create(this_00,(string *)local_138,(string *)local_210);
  if ((pointer)local_210._0_8_ != pcVar2) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if ((pointer)local_138._0_8_ != pcVar3) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  State::State((State *)local_138);
  iVar9 = g_current_test->assertion_failures_;
  StateTestWithBuiltinRules::AddCatRule((StateTestWithBuiltinRules *)this,(State *)local_138);
  iVar4 = g_current_test->assertion_failures_;
  if (iVar9 == iVar4) {
    AssertParse((State *)local_138,"build out: cat in1\n  deps = gcc\n  depfile = in1.d\n",
                (ManifestParserOptions)0x0);
    if (iVar4 == g_current_test->assertion_failures_) {
      (this->super_BuildWithDepsLogTest).super_BuildTest.config_.dry_run = true;
      Builder::Builder((Builder *)local_210,(State *)local_138,
                       &(this->super_BuildWithDepsLogTest).super_BuildTest.config_,(BuildLog *)0x0,
                       (DepsLog *)0x0,&this_00->super_DiskInterface);
      _Var7._M_head_impl =
           &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.super_CommandRunner;
      if ((__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)
          local_190._M_head_impl !=
          (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
        lVar5 = *(long *)local_190._M_head_impl;
        local_190._M_head_impl = _Var7._M_head_impl;
        (**(code **)(lVar5 + 8))();
        _Var7._M_head_impl = local_190._M_head_impl;
      }
      local_190._M_head_impl = _Var7._M_head_impl;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                         commands_ran_,
                        (this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                        commands_ran_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      pTVar6 = g_current_test;
      local_250._M_string_length = 0;
      local_250.field_2._M_local_buf[0] = '\0';
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"out","");
      pNVar10 = Builder::AddTarget((Builder *)local_210,&local_230,&local_250);
      testing::Test::Check
                (pTVar6,pNVar10 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x8d9,"builder.AddTarget(\"out\", &err)");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      pTVar6 = g_current_test;
      iVar9 = std::__cxx11::string::compare((char *)&local_250);
      bVar8 = testing::Test::Check
                        (pTVar6,iVar9 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x8da,"\"\" == err");
      pTVar6 = g_current_test;
      if (bVar8) {
        bVar8 = Builder::Build((Builder *)local_210,&local_250);
        testing::Test::Check
                  (pTVar6,bVar8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x8db,"builder.Build(&err)");
        bVar8 = testing::Test::Check
                          (g_current_test,
                           (long)*(pointer *)
                                  ((long)&(this->super_BuildWithDepsLogTest).super_BuildTest.
                                          command_runner_.commands_ran_.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data + 8) -
                           (long)(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                                 commands_ran_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start == 0x20,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x8dc,"1u == command_runner_.commands_ran_.size()");
        if (bVar8) {
          local_190._M_head_impl = (CommandRunner *)0x0;
        }
        else {
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        }
      }
      else {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,
                        CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                                 local_250.field_2._M_local_buf[0]) + 1);
      }
      Builder::~Builder((Builder *)local_210);
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = iVar4 + 1;
  }
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  local_b8 = &PTR__BindingEnv_001d8ce8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_80);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_b0);
  if (local_d0 != (pointer)0x0) {
    operator_delete(local_d0,(long)local_c0 - (long)local_d0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&local_100);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_138);
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, DepsIgnoredInDryRun) {
  const char* manifest =
      "build out: cat in1\n"
      "  deps = gcc\n"
      "  depfile = in1.d\n";

  fs_.Create("out", "");
  fs_.Tick();
  fs_.Create("in1", "");

  State state;
  ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

  // The deps log is NULL in dry runs.
  config_.dry_run = true;
  Builder builder(&state, config_, NULL, NULL, &fs_);
  builder.command_runner_.reset(&command_runner_);
  command_runner_.commands_ran_.clear();

  string err;
  EXPECT_TRUE(builder.AddTarget("out", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder.Build(&err));
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());

  builder.command_runner_.release();
}